

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall
libtorrent::peer_disconnected_alert::~peer_disconnected_alert(peer_disconnected_alert *this)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  
  pcVar3 = (this->msg)._M_dataplus._M_p;
  paVar2 = &(this->msg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_alert_00460038;
  pcVar3 = (this->super_peer_alert).super_torrent_alert.name._M_dataplus._M_p;
  paVar2 = &(this->super_peer_alert).super_torrent_alert.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar2) {
    operator_delete(pcVar3,paVar2->_M_allocated_capacity + 1);
  }
  p_Var4 = (this->super_peer_alert).super_torrent_alert.handle.m_torrent.
           super___weak_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

struct TORRENT_EXPORT peer_disconnected_alert final : peer_alert
	{
		// internal
		peer_disconnected_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, peer_id const& peer_id, operation_t op, int type, error_code const& e
			, close_reason_t r);

		TORRENT_DEFINE_ALERT(peer_disconnected_alert, 24)

		static constexpr alert_category_t static_category = alert_category::connect;
		std::string message() const override;

		// the kind of socket this peer was connected over
		int const socket_type;

		// the operation or level where the error occurred. Specified as an
		// value from the operation_t enum. Defined in operations.hpp.
		operation_t const op;

		// tells you what error caused peer to disconnect.
		error_code const error;

		// the reason the peer disconnected (if specified)
		close_reason_t const reason;

#if TORRENT_ABI_VERSION == 1
		int const TORRENT_DEPRECATED_MEMBER operation;
		std::string TORRENT_DEPRECATED_MEMBER msg;
#endif
	}